

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

int64_t soul::heart::getClockRatioFromValue<soul::CodeLocation&>
                  (CodeLocation *errorLocation,Value *value)

{
  ulong uVar1;
  CompileMessage CStack_b8;
  CompileMessage local_80;
  CompileMessage local_48;
  
  if ((1 < (value->type).primitiveType.type - int32) || ((value->type).category != primitive)) {
    Errors::ratioMustBeInteger<>();
    CodeLocation::throwError(errorLocation,&local_48);
  }
  uVar1 = soul::Value::getAsInt64(value);
  if (uVar1 - 0x201 < 0xfffffffffffffe00) {
    Errors::ratioOutOfRange<>();
    CodeLocation::throwError(errorLocation,&local_80);
  }
  if ((uVar1 & uVar1 - 1) == 0) {
    return uVar1;
  }
  Errors::ratioMustBePowerOf2<>();
  CodeLocation::throwError(errorLocation,&CStack_b8);
}

Assistant:

static int64_t getClockRatioFromValue (Thrower&& errorLocation, const Value& value)
    {
        if (! value.getType().isPrimitiveInteger())
            errorLocation.throwError (Errors::ratioMustBeInteger());

        auto v = value.getAsInt64();

        if (v < 1 || v > 512)
            errorLocation.throwError (Errors::ratioOutOfRange());

        if (! choc::math::isPowerOf2 (v))
            errorLocation.throwError (Errors::ratioMustBePowerOf2());

        return v;
    }